

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

void png_colorspace_set_rgb_coefficients(png_structrp png_ptr)

{
  int iVar1;
  int iVar2;
  uint local_24;
  int add;
  png_fixed_point total;
  png_fixed_point b;
  png_fixed_point g;
  png_fixed_point r;
  png_structrp png_ptr_local;
  
  if ((png_ptr->rgb_to_gray_coefficients_set == '\0') && (((png_ptr->colorspace).flags & 2) != 0)) {
    b = (png_ptr->colorspace).end_points_XYZ.red_Y;
    total = (png_ptr->colorspace).end_points_XYZ.green_Y;
    add = (png_ptr->colorspace).end_points_XYZ.blue_Y;
    iVar1 = b + total + add;
    _g = png_ptr;
    if (((((iVar1 < 1) ||
          (((b < 0 || (iVar2 = png_muldiv(&b,b,0x8000,iVar1), iVar2 == 0)) || (b < 0)))) ||
         (((0x8000 < b || (total < 0)) ||
          (iVar2 = png_muldiv(&total,total,0x8000,iVar1), iVar2 == 0)))) ||
        ((total < 0 || (0x8000 < total)))) ||
       ((add < 0 ||
        ((((iVar1 = png_muldiv(&add,add,0x8000,iVar1), iVar1 == 0 || (add < 0)) || (0x8000 < add))
         || (0x8001 < b + total + add)))))) {
      png_error(_g,"internal error handling cHRM->XYZ");
    }
    if (b + total + add < 0x8001) {
      local_24 = (uint)(b + total + add < 0x8000);
    }
    else {
      local_24 = 0xffffffff;
    }
    if (local_24 != 0) {
      if ((total < b) || (total < add)) {
        if ((b < total) || (b < add)) {
          add = local_24 + add;
        }
        else {
          b = local_24 + b;
        }
      }
      else {
        total = local_24 + total;
      }
    }
    if (b + total + add != 0x8000) {
      png_error(_g,"internal error handling cHRM coefficients");
    }
    _g->rgb_to_gray_red_coeff = (png_uint_16)b;
    _g->rgb_to_gray_green_coeff = (png_uint_16)total;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_colorspace_set_rgb_coefficients(png_structrp png_ptr)
{
   /* Set the rgb_to_gray coefficients from the colorspace. */
   if (png_ptr->rgb_to_gray_coefficients_set == 0 &&
      (png_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      /* png_set_background has not been called, get the coefficients from the Y
       * values of the colorspace colorants.
       */
      png_fixed_point r = png_ptr->colorspace.end_points_XYZ.red_Y;
      png_fixed_point g = png_ptr->colorspace.end_points_XYZ.green_Y;
      png_fixed_point b = png_ptr->colorspace.end_points_XYZ.blue_Y;
      png_fixed_point total = r+g+b;

      if (total > 0 &&
         r >= 0 && png_muldiv(&r, r, 32768, total) && r >= 0 && r <= 32768 &&
         g >= 0 && png_muldiv(&g, g, 32768, total) && g >= 0 && g <= 32768 &&
         b >= 0 && png_muldiv(&b, b, 32768, total) && b >= 0 && b <= 32768 &&
         r+g+b <= 32769)
      {
         /* We allow 0 coefficients here.  r+g+b may be 32769 if two or
          * all of the coefficients were rounded up.  Handle this by
          * reducing the *largest* coefficient by 1; this matches the
          * approach used for the default coefficients in pngrtran.c
          */
         int add = 0;

         if (r+g+b > 32768)
            add = -1;
         else if (r+g+b < 32768)
            add = 1;

         if (add != 0)
         {
            if (g >= r && g >= b)
               g += add;
            else if (r >= g && r >= b)
               r += add;
            else
               b += add;
         }

         /* Check for an internal error. */
         if (r+g+b != 32768)
            png_error(png_ptr,
                "internal error handling cHRM coefficients");

         else
         {
            png_ptr->rgb_to_gray_red_coeff   = (png_uint_16)r;
            png_ptr->rgb_to_gray_green_coeff = (png_uint_16)g;
         }
      }

      /* This is a png_error at present even though it could be ignored -
       * it should never happen, but it is important that if it does, the
       * bug is fixed.
       */
      else
         png_error(png_ptr, "internal error handling cHRM->XYZ");
   }
}